

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void ffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  long StageCnt;
  long lVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  float *NDiffU;
  unsigned_long ColstartShift;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  long lVar26;
  float *pfVar27;
  long lVar28;
  ulong uVar29;
  unsigned_long posA;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lStack_b0;
  float *local_88;
  unsigned_long Nroot_1;
  
  auVar48 = _DAT_00107180;
  switch(M) {
  case 0:
    break;
  case 1:
    while (0 < Rows) {
      auVar38 = *(undefined1 (*) [16])ioptr;
      Rows = Rows + -1;
      auVar35 = vshufpd_avx(auVar38,auVar38,1);
      auVar40 = vsubps_avx(auVar35,auVar38);
      *(ulong *)*(undefined1 (*) [16])ioptr =
           CONCAT44(auVar35._4_4_ + auVar38._4_4_,auVar35._0_4_ + auVar38._0_4_);
      *(long *)(*(undefined1 (*) [16])ioptr + 8) = auVar40._8_8_;
      ioptr = (float *)((long)ioptr + 0x10);
    }
    break;
  case 2:
    while (0 < Rows) {
      auVar37 = *(undefined1 (*) [32])ioptr;
      Rows = Rows + -1;
      auVar36 = vpermpd_avx2(auVar37,0x4e);
      auVar45._0_4_ = auVar37._0_4_ + auVar36._0_4_;
      auVar45._4_4_ = auVar37._4_4_ + auVar36._4_4_;
      auVar45._8_4_ = auVar37._8_4_ + auVar36._8_4_;
      auVar45._12_4_ = auVar37._12_4_ + auVar36._12_4_;
      auVar45._16_4_ = auVar37._16_4_ + auVar36._16_4_;
      auVar45._20_4_ = auVar37._20_4_ + auVar36._20_4_;
      auVar45._24_4_ = auVar37._24_4_ + auVar36._24_4_;
      auVar45._28_4_ = auVar37._28_4_ + auVar36._28_4_;
      auVar37 = vsubps_avx(auVar37,auVar36);
      auVar36 = vpermt2ps_avx512vl(auVar45,auVar48,auVar37);
      auVar37 = vpermpd_avx2(auVar36,0x4e);
      auVar41._0_4_ = auVar36._0_4_ + auVar37._0_4_;
      auVar41._4_4_ = auVar36._4_4_ + auVar37._4_4_;
      auVar41._8_4_ = auVar36._8_4_ + auVar37._8_4_;
      auVar41._12_4_ = auVar36._12_4_ + auVar37._12_4_;
      auVar41._16_4_ = auVar36._16_4_ + auVar37._16_4_;
      auVar41._20_4_ = auVar36._20_4_ + auVar37._20_4_;
      auVar41._24_4_ = auVar36._24_4_ + auVar37._24_4_;
      auVar41._28_4_ = auVar36._28_4_ + auVar37._28_4_;
      auVar37 = vsubps_avx(auVar36,auVar37);
      auVar37 = vblendps_avx(auVar41,auVar37,0x78);
      *(undefined1 (*) [32])ioptr = auVar37;
      ioptr = (float *)((long)ioptr + 0x20);
    }
    break;
  case 3:
    auVar39._8_4_ = 0x40000000;
    auVar39._0_8_ = 0x4000000040000000;
    auVar39._12_4_ = 0x40000000;
    auVar38 = ZEXT816(0x3f3504f3bf3504f3);
    while (0 < Rows) {
      uVar16 = *(ulong *)(*(undefined1 (*) [32])((long)ioptr + 0x20) + 8);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar16;
      uVar22 = *(ulong *)(*(undefined1 (*) [32])ioptr + 8);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar22;
      uVar29 = *(ulong *)(*(undefined1 (*) [32])ioptr + 0x18);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar29;
      uVar5 = *(ulong *)(*(undefined1 (*) [32])((long)ioptr + 0x20) + 0x18);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar5;
      uVar6 = *(ulong *)(*(undefined1 (*) [32])((long)ioptr + 0x20) + 0x10);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar6;
      uVar2 = *(ulong *)(*(undefined1 (*) [32])ioptr + 0x10);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar2;
      uVar3 = *(ulong *)*(undefined1 (*) [32])((long)ioptr + 0x20);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar3;
      uVar4 = *(ulong *)*(undefined1 (*) [32])ioptr;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar4;
      Rows = Rows + -1;
      auVar64._0_4_ = (float)uVar16 + (float)uVar22;
      auVar64._4_4_ = (float)(uVar16 >> 0x20) + (float)(uVar22 >> 0x20);
      auVar64._8_8_ = 0;
      auVar35 = vsubps_avx(auVar55,auVar49);
      auVar34 = vsubps_avx(auVar58,auVar60);
      auVar62._0_4_ = (float)uVar2 + (float)uVar6;
      auVar62._4_4_ = (float)(uVar2 >> 0x20) + (float)(uVar6 >> 0x20);
      auVar62._8_8_ = 0;
      auVar40 = vsubps_avx(auVar57,auVar46);
      auVar61._0_4_ = (float)uVar3 + (float)uVar4;
      auVar61._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar4 >> 0x20);
      auVar61._8_8_ = 0;
      auVar65._0_4_ = (float)uVar5 + (float)uVar29;
      auVar65._4_4_ = (float)(uVar5 >> 0x20) + (float)(uVar29 >> 0x20);
      auVar65._8_8_ = 0;
      auVar44 = vsubps_avx(auVar52,auVar42);
      auVar35 = vshufps_avx(auVar35,auVar35,0xe1);
      auVar40 = vshufps_avx(auVar40,auVar40,0xe1);
      auVar63._0_4_ = auVar62._0_4_ + auVar61._0_4_;
      auVar63._4_4_ = auVar62._4_4_ + auVar61._4_4_;
      auVar63._8_8_ = 0;
      auVar31 = vaddps_avx512vl(auVar65,auVar64);
      auVar33 = vsubps_avx(auVar35,auVar34);
      auVar50._0_4_ = auVar34._0_4_ + auVar35._0_4_;
      auVar50._4_4_ = auVar34._4_4_ + auVar35._4_4_;
      auVar50._8_4_ = auVar34._8_4_ + auVar35._8_4_;
      auVar50._12_4_ = auVar34._12_4_ + auVar35._12_4_;
      auVar53._0_4_ = auVar44._0_4_ + auVar40._0_4_;
      auVar53._4_4_ = auVar44._4_4_ + auVar40._4_4_;
      auVar53._8_4_ = auVar44._8_4_ + auVar40._8_4_;
      auVar53._12_4_ = auVar44._12_4_ + auVar40._12_4_;
      auVar44 = vsubps_avx(auVar44,auVar40);
      auVar32 = vaddps_avx512vl(auVar31,auVar63);
      auVar35 = vblendps_avx(auVar33,auVar50,2);
      auVar34 = vmovshdup_avx(auVar33);
      auVar33 = vmovshdup_avx512vl(auVar44);
      auVar40 = vblendps_avx(auVar53,auVar44,2);
      auVar56._0_4_ = auVar35._0_4_ * auVar38._0_4_;
      auVar56._4_4_ = auVar35._4_4_ * auVar38._4_4_;
      auVar56._8_4_ = auVar35._8_4_ * 0.0;
      auVar56._12_4_ = auVar35._12_4_ * 0.0;
      fVar14 = auVar34._0_4_ * 0.70710677;
      auVar35 = vmovshdup_avx(auVar56);
      auVar34 = vaddss_avx512f(auVar56,auVar33);
      fVar15 = (auVar56._0_4_ + auVar53._0_4_) - auVar35._0_4_;
      fVar13 = auVar35._0_4_ + auVar34._0_4_;
      auVar35 = vinsertps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar13),0x10);
      auVar35 = vfmsub231ps_fma(auVar35,auVar39,auVar40);
      auVar48._16_16_ = auVar35;
      auVar48._0_16_ = auVar38;
      auVar35 = vblendps_avx(auVar44,auVar53,2);
      auVar40 = vmovshdup_avx(auVar53);
      auVar34 = vsubps_avx(auVar64,auVar65);
      auVar40 = vinsertps_avx(ZEXT416((uint)(auVar44._0_4_ - auVar50._0_4_ * 0.70710677)),
                              ZEXT416((uint)(auVar50._0_4_ * 0.70710677 + auVar40._0_4_)),0x10);
      auVar34 = vshufps_avx(auVar34,auVar34,0xe1);
      auVar43._0_4_ = auVar40._0_4_ + fVar14;
      auVar43._4_4_ = auVar40._4_4_ + fVar14;
      auVar43._8_4_ = auVar40._8_4_ + fVar14;
      auVar43._12_4_ = auVar40._12_4_ + fVar14;
      auVar35 = vfmsub213ps_fma(auVar35,auVar39,auVar43);
      auVar37._16_16_ = auVar35;
      auVar37._0_16_ = auVar38;
      auVar48 = vperm2f128_avx(auVar48,auVar37,0x31);
      auVar35 = vsubps_avx(auVar61,auVar62);
      auVar59._0_4_ = auVar35._0_4_ + auVar34._0_4_;
      auVar59._4_4_ = auVar35._4_4_ + auVar34._4_4_;
      auVar59._8_4_ = auVar35._8_4_ + auVar34._8_4_;
      auVar59._12_4_ = auVar35._12_4_ + auVar34._12_4_;
      auVar40 = vsubps_avx(auVar35,auVar34);
      auVar35 = vblendps_avx(auVar59,auVar40,2);
      auVar37 = vinsertf32x4_avx512vl(ZEXT1632(auVar32),auVar35,1);
      auVar48 = vunpcklpd_avx(auVar37,auVar48);
      *(undefined1 (*) [32])ioptr = auVar48;
      auVar35 = vsubps_avx512vl(auVar63,auVar31);
      uVar7 = vmovlps_avx(auVar35);
      *(undefined8 *)*(undefined1 (*) [32])((long)ioptr + 0x20) = uVar7;
      auVar35 = vblendps_avx(auVar40,auVar59,2);
      *(float *)(*(undefined1 (*) [32])((long)ioptr + 0x20) + 8) = fVar15;
      *(float *)(*(undefined1 (*) [32])((long)ioptr + 0x20) + 0xc) = fVar13;
      auVar35 = vmovlhps_avx(auVar35,auVar43);
      *(undefined1 (*) [16])(*(undefined1 (*) [32])((long)ioptr + 0x20) + 0x10) = auVar35;
      ioptr = (float *)((long)ioptr + 0x40);
    }
    break;
  default:
    lVar28 = 1L << ((M + 3) / 2 & 0x3fU);
    lVar30 = 1L << (M & 0x3fU);
    uVar16 = ~(-1L << ((ulong)((int)(M / 2) - 1) & 0x3f));
    lVar26 = 1L << ((ulong)(byte)((char)(M / 2) + 1) & 0x3f);
    StageCnt = (M + -1) / 3;
    pfVar20 = ioptr + (lVar30 - lVar28);
    lVar1 = StageCnt * -3 + -1 + M;
    lVar17 = 2L << (M & 0x3fU);
    local_88 = ioptr + (lVar30 * 2 - lVar28);
    for (; 0 < Rows; Rows = Rows + -1) {
      pfVar19 = local_88;
      NDiffU = pfVar20;
      for (pfVar21 = ioptr; uVar22 = uVar16, pfVar21 < ioptr + lVar28; pfVar21 = pfVar21 + lVar26) {
        while (-1 < (long)uVar22) {
          lVar24 = uVar22 << ((M + 1) / 2 + 1U & 0x3f);
          lVar23 = (long)((int)BRLow[uVar22] << 2);
          pfVar25 = pfVar19;
          pfVar27 = NDiffU;
          uVar29 = uVar16;
          while( true ) {
            uVar5 = *(ulong *)(pfVar27 + lVar23);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar5;
            uVar6 = *(ulong *)(pfVar25 + lVar23);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar6;
            auVar40._0_4_ = (float)uVar6 + (float)uVar5;
            auVar40._4_4_ = (float)(uVar6 >> 0x20) + (float)(uVar5 >> 0x20);
            auVar40._8_8_ = 0;
            if ((long)uVar29 <= (long)uVar22) break;
            lVar18 = (long)BRLow[uVar29];
            auVar38 = vsubps_avx(auVar38,auVar35);
            uVar7 = *(undefined8 *)(pfVar27 + lVar23 + 2);
            auVar33._8_8_ = uVar7;
            auVar33._0_8_ = uVar7;
            uVar29 = uVar29 - 1;
            auVar38 = vmovlhps_avx(auVar40,auVar38);
            uVar8 = *(undefined8 *)(pfVar25 + lVar23 + 2);
            auVar31._8_8_ = uVar8;
            auVar31._0_8_ = uVar8;
            uVar9 = *(undefined8 *)(pfVar21 + lVar24 + lVar18 * 4);
            auVar32._8_8_ = uVar9;
            auVar32._0_8_ = uVar9;
            uVar10 = *(undefined8 *)(pfVar21 + lVar24 + lVar18 * 4 + 2);
            auVar51._8_8_ = uVar10;
            auVar51._0_8_ = uVar10;
            uVar11 = *(undefined8 *)(pfVar21 + lVar24 + lVar18 * 4 + lVar30);
            auVar47._8_8_ = uVar11;
            auVar47._0_8_ = uVar11;
            uVar12 = *(undefined8 *)(pfVar21 + lVar24 + lVar18 * 4 + lVar30 + 2);
            auVar54._8_8_ = uVar12;
            auVar54._0_8_ = uVar12;
            *(undefined1 (*) [16])(pfVar21 + lVar24 + lVar18 * 4) = auVar38;
            auVar38 = vsubps_avx(auVar33,auVar31);
            *(ulong *)(pfVar21 + lVar24 + lVar18 * 4 + lVar30) =
                 CONCAT44((float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                          (float)uVar8 + (float)uVar7);
            *(long *)(pfVar21 + lVar24 + lVar18 * 4 + lVar30 + 2) = auVar38._8_8_;
            auVar38 = vsubps_avx(auVar32,auVar47);
            auVar35 = vsubps_avx(auVar51,auVar54);
            *(ulong *)(pfVar27 + lVar23) =
                 CONCAT44((float)((ulong)uVar11 >> 0x20) + (float)((ulong)uVar9 >> 0x20),
                          (float)uVar11 + (float)uVar9);
            *(long *)(pfVar27 + lVar23 + 2) = auVar38._8_8_;
            pfVar27 = pfVar27 + -lVar28;
            *(ulong *)(pfVar25 + lVar23) =
                 CONCAT44((float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar10 >> 0x20),
                          (float)uVar12 + (float)uVar10);
            *(long *)(pfVar25 + lVar23 + 2) = auVar35._8_8_;
            pfVar25 = pfVar25 + -lVar28;
          }
          auVar38 = vsubps_avx(auVar38,auVar35);
          uVar7 = *(undefined8 *)(pfVar27 + lVar23 + 2);
          auVar34._8_8_ = uVar7;
          auVar34._0_8_ = uVar7;
          uVar8 = *(undefined8 *)(pfVar25 + lVar23 + 2);
          auVar44._8_8_ = uVar8;
          auVar44._0_8_ = uVar8;
          auVar38 = vmovlhps_avx(auVar40,auVar38);
          *(undefined1 (*) [16])(pfVar27 + lVar23) = auVar38;
          auVar38 = vsubps_avx(auVar34,auVar44);
          *(ulong *)(pfVar25 + lVar23) =
               CONCAT44((float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                        (float)uVar8 + (float)uVar7);
          *(long *)(pfVar25 + lVar23 + 2) = auVar38._8_8_;
          uVar22 = uVar22 - 1;
        }
        NDiffU = NDiffU + lVar26;
        pfVar19 = pfVar19 + lVar26;
      }
      if (lVar1 == 2) {
        bfR4(ioptr,M,2);
        lStack_b0 = 8;
      }
      else {
        lStack_b0 = 2;
        if (lVar1 == 1) {
          bfR2(ioptr,M,(long)NDiffU);
          lStack_b0 = 4;
        }
      }
      if ((ulong)M < 0xc) {
        bfstages(ioptr,M,Utbl,1,lStack_b0,StageCnt);
      }
      else {
        fftrecurs(ioptr,M,Utbl,1,lStack_b0,StageCnt);
      }
      local_88 = local_88 + lVar17;
      ioptr = ioptr + lVar17;
      pfVar20 = pfVar20 + lVar17;
    }
  }
  return;
}

Assistant:

void ffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		fft2pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		fft4pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		fft8pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		bitrevR2(ioptr, M, BRLow);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			bfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			fftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}